

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_union_cube(MDD a,uint32_t *values,size_t count)

{
  uint uVar1;
  uint8_t *puVar2;
  MDD MVar3;
  MDD MVar4;
  uint value;
  long lVar5;
  
  if (a == 1) {
    if (count == 0) {
      return 1;
    }
    __assert_fail("count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x6f5,"MDD lddmc_union_cube(MDD, uint32_t *, size_t)");
  }
  if (a == 0) {
    MVar3 = lddmc_cube(values,count);
    return MVar3;
  }
  if (count != 0) {
    lVar5 = a * 0x10;
    value = *values;
    puVar2 = nodes->data;
    uVar1 = *(uint *)(puVar2 + lVar5 + 6);
    if (uVar1 < value) {
      MVar4 = lddmc_union_cube(*(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff,values,count);
      if (MVar4 == (*(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff)) {
        return a;
      }
      MVar3 = *(ulong *)(puVar2 + lVar5 + 8) >> 0x11;
      a = MVar4;
      value = uVar1;
    }
    else if (uVar1 == value) {
      MVar3 = lddmc_union_cube(*(ulong *)(puVar2 + lVar5 + 8) >> 0x11,values + 1,count - 1);
      if (MVar3 == *(ulong *)(puVar2 + lVar5 + 8) >> 0x11) {
        return a;
      }
      a = *(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff;
      value = uVar1;
    }
    else {
      MVar3 = lddmc_cube(values + 1,count - 1);
    }
    MVar3 = lddmc_makenode(value,MVar3,a);
    return MVar3;
  }
  __assert_fail("count != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0x6f8,"MDD lddmc_union_cube(MDD, uint32_t *, size_t)");
}

Assistant:

MDD
lddmc_union_cube(MDD a, uint32_t* values, size_t count)
{
    if (a == lddmc_false) return lddmc_cube(values, count);
    if (a == lddmc_true) {
        assert(count == 0);
        return lddmc_true;
    }
    assert(count != 0);

    mddnode_t na = LDD_GETNODE(a);
    uint32_t na_value = mddnode_getvalue(na);

    /* Only create a new node if something actually changed */

    if (na_value < *values) {
        MDD right = lddmc_union_cube(mddnode_getright(na), values, count);
        if (right == mddnode_getright(na)) return a; // no actual change
        return lddmc_makenode(na_value, mddnode_getdown(na), right);
    } else if (na_value == *values) {
        MDD down = lddmc_union_cube(mddnode_getdown(na), values+1, count-1);
        if (down == mddnode_getdown(na)) return a; // no actual change
        return lddmc_makenode(na_value, down, mddnode_getright(na));
    } else /* na_value > *values */ {
        return lddmc_makenode(*values, lddmc_cube(values+1, count-1), a);
    }
}